

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O1

void __thiscall spdlog::details::backtracer::enable(backtracer *this,size_t size)

{
  int iVar1;
  vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_> local_58
  ;
  vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_> local_38
  ;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    (this->enabled_)._M_base._M_i = true;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    vector(&local_58,size + 1,(allocator_type *)&local_38);
    (this->messages_).max_items_ = size + 1;
    (this->messages_).head_ = 0;
    (this->messages_).tail_ = 0;
    (this->messages_).overrun_counter_ = 0;
    local_38.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->messages_).v_.
         super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_38.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->messages_).v_.
         super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->messages_).v_.
         super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->messages_).v_.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->messages_).v_.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->messages_).v_.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    ~vector(&local_38);
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    ~vector(&local_58);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void backtracer::enable(size_t size)
{
    std::lock_guard<std::mutex> lock{mutex_};
    enabled_.store(true, std::memory_order_relaxed);
    messages_ = circular_q<log_msg_buffer>{size};
}